

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O1

int __thiscall
EventDispatcherHelper::removeEventListener
          (EventDispatcherHelper *this,IEventListener *listener,int event_id)

{
  EventListenerNode *pEVar1;
  Node *pNVar2;
  bool bVar3;
  AutoLock _auto_lock_;
  AutoLock local_30;
  
  AutoLock::AutoLock(&local_30,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                     ,0x74);
  pNVar2 = ((this->mEventList).mHead)->next;
  do {
    bVar3 = pNVar2 == (this->mEventList).mTail;
    if (bVar3) {
LAB_0011625e:
      AutoLock::~AutoLock(&local_30);
      return -(uint)bVar3;
    }
    pEVar1 = pNVar2->val;
    if ((pEVar1->mEventId == event_id) && (pEVar1->mListener == listener)) {
      pEVar1->mListener = (IEventListener *)0x0;
      goto LAB_0011625e;
    }
    pNVar2 = pNVar2->next;
  } while( true );
}

Assistant:

int EventDispatcherHelper::removeEventListener( IEventListener *listener, int event_id )
{
	DebugAutoLock( mLock );

	for (JetHead::list<EventListenerNode*>::iterator i = mEventList.begin();
		 i != mEventList.end(); ++i)
	{
		EventListenerNode *lnode = *i;
		
		if ( lnode->mEventId == event_id && lnode->mListener == listener )
		{
			// Update mListener 
			lnode->mListener = NULL;
			return 0;
		}
	}

	// Didn't find it
	return -1;
}